

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

xmlParserCtxtPtr xmlCreateURLParserCtxt(char *filename,int options)

{
  int iVar1;
  xmlParserCtxtPtr ctxt;
  xmlParserInputPtr value;
  
  ctxt = xmlNewParserCtxt();
  if (ctxt != (xmlParserCtxtPtr)0x0) {
    xmlCtxtUseOptions(ctxt,options | 0x1000000);
    ctxt->linenumbers = 1;
    value = xmlLoadResource(ctxt,filename,(char *)0x0,XML_RESOURCE_MAIN_DOCUMENT);
    if (value != (xmlParserInputPtr)0x0) {
      iVar1 = xmlCtxtPushInput(ctxt,value);
      if (-1 < iVar1) {
        return ctxt;
      }
      xmlFreeInputStream(value);
    }
    xmlFreeParserCtxt(ctxt);
  }
  return (xmlParserCtxtPtr)0x0;
}

Assistant:

xmlParserCtxtPtr
xmlCreateURLParserCtxt(const char *filename, int options)
{
    xmlParserCtxtPtr ctxt;
    xmlParserInputPtr input;

    ctxt = xmlNewParserCtxt();
    if (ctxt == NULL)
	return(NULL);

    options |= XML_PARSE_UNZIP;

    xmlCtxtUseOptions(ctxt, options);
    ctxt->linenumbers = 1;

    input = xmlLoadResource(ctxt, filename, NULL, XML_RESOURCE_MAIN_DOCUMENT);
    if (input == NULL) {
	xmlFreeParserCtxt(ctxt);
	return(NULL);
    }
    if (xmlCtxtPushInput(ctxt, input) < 0) {
        xmlFreeInputStream(input);
        xmlFreeParserCtxt(ctxt);
        return(NULL);
    }

    return(ctxt);
}